

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

string * dotFilter(string *name)

{
  char *local_1a8;
  char *str;
  stringstream ss;
  ostream local_190 [384];
  string *name_local;
  
  name_local = name;
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  for (local_1a8 = (char *)std::__cxx11::string::c_str(); *local_1a8 != '\0';
      local_1a8 = local_1a8 + 1) {
    if ((*local_1a8 == '<') || (*local_1a8 == '>')) {
      std::operator<<(local_190,"\\");
    }
    std::operator<<(local_190,*local_1a8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  return name;
}

Assistant:

static
std::string dotFilter(const std::string& name) {
	std::stringstream ss;

	const char* str = name.c_str();
	while (*str) {
		if (*str == '<' || *str == '>')
			ss << "\\";

		ss << *str;
		str++;
	}

	return ss.str();
}